

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

optional<slang::SourceLocation> __thiscall slang::parsing::Trivia::getExplicitLocation(Trivia *this)

{
  TriviaKind TVar1;
  _Storage<slang::SourceLocation,_true> _Var2;
  Info *pIVar3;
  _Storage<slang::SourceLocation,_true> *p_Var4;
  undefined8 uVar5;
  Token TVar6;
  optional<slang::SourceLocation> oVar7;
  
  TVar1 = this->kind;
  _Var2._1_7_ = 0;
  _Var2._0_1_ = TVar1;
  if (TVar1 - 7 < 2) {
    TVar6 = slang::syntax::SyntaxNode::getFirstToken((this->field_0).syntaxNode);
    pIVar3 = TVar6.info;
LAB_00187459:
    if (pIVar3 == (Info *)0x0) {
      p_Var4 = (_Storage<slang::SourceLocation,_true> *)&SourceLocation::NoLocation;
    }
    else {
      p_Var4 = (_Storage<slang::SourceLocation,_true> *)&pIVar3->location;
    }
  }
  else {
    if (TVar1 == SkippedTokens) {
      if ((this->field_0).rawText.len == 0) {
        assert::assertFailed
                  ("tokens.len",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/parsing/Token.cpp"
                   ,0x79,
                   "std::optional<SourceLocation> slang::parsing::Trivia::getExplicitLocation() const"
                  );
      }
      pIVar3 = ((this->field_0).tokens.ptr)->info;
      goto LAB_00187459;
    }
    if (this->hasFullLocation != true) {
      uVar5 = 0;
      goto LAB_0018747f;
    }
    p_Var4 = (_Storage<slang::SourceLocation,_true> *)((this->field_0).rawText.ptr + 0x10);
  }
  _Var2 = *p_Var4;
  uVar5 = CONCAT71((int7)((ulong)p_Var4 >> 8),1);
LAB_0018747f:
  oVar7.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceLocation>._8_8_ = uVar5;
  oVar7.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceLocation>._M_payload = _Var2;
  return (optional<slang::SourceLocation>)
         oVar7.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
         super__Optional_payload_base<slang::SourceLocation>;
}

Assistant:

std::optional<SourceLocation> Trivia::getExplicitLocation() const {
    switch (kind) {
        case TriviaKind::Directive:
        case TriviaKind::SkippedSyntax:
            return syntaxNode->getFirstToken().location();
        case TriviaKind::SkippedTokens:
            ASSERT(tokens.len);
            return tokens.ptr[0].location();
        default:
            if (hasFullLocation)
                return fullLocation->location;

            return std::nullopt;
    }
}